

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O3

void __thiscall NumberTemp::ProcessInstr(NumberTemp *this,Instr *instr,BackwardPass *backwardPass)

{
  SymID stackSymID;
  Type TVar1;
  Opnd *this_00;
  SymTable *this_01;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  undefined4 *puVar5;
  NumberTemp *pNVar6;
  Type_conflict pBVar7;
  StackSym *pSVar8;
  BVSparse<Memory::JitArenaAllocator> *bv2;
  RegOpnd *pRVar9;
  PropertySym *pPVar10;
  BVSparse<Memory::JitArenaAllocator> **ppBVar11;
  ulong uVar12;
  ulong uVar13;
  
  if (instr->m_opcode == BailOnNoProfile) {
    pNVar6 = this;
    if (this->nonTempElemLoad == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                         ,600,"(!this->nonTempElemLoad)","!this->nonTempElemLoad");
      if (!bVar3) goto LAB_0063122a;
      *puVar5 = 0;
    }
    do {
      pNVar6 = (NumberTemp *)(pNVar6->super_TempTrackerBase).nonTempSyms.head;
      if (pNVar6 == (NumberTemp *)0x0) goto LAB_00630f02;
    } while (((Type *)&(pNVar6->super_TempTrackerBase).nonTempSyms.alloc)->word == 0);
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                       ,0x259,"(this->nonTempSyms.IsEmpty())","this->nonTempSyms.IsEmpty()");
    if (!bVar3) goto LAB_0063122a;
    *puVar5 = 0;
LAB_00630f02:
    pBVar7 = (Type_conflict)&(this->super_TempTrackerBase).tempTransferredSyms;
    do {
      pBVar7 = pBVar7->next;
      if (pBVar7 == (Type_conflict)0x0) goto LAB_00630f6b;
    } while ((pBVar7->data).word == 0);
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                       ,0x25a,"(this->tempTransferredSyms.IsEmpty())",
                       "this->tempTransferredSyms.IsEmpty()");
    if (!bVar3) goto LAB_0063122a;
    *puVar5 = 0;
LAB_00630f6b:
    pBVar7 = (Type_conflict)&this->elemLoadDependencies;
    do {
      pBVar7 = pBVar7->next;
      if (pBVar7 == (Type_conflict)0x0) goto LAB_00630fd4;
    } while ((pBVar7->data).word == 0);
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                       ,0x25b,"(this->elemLoadDependencies.IsEmpty())",
                       "this->elemLoadDependencies.IsEmpty()");
    if (!bVar3) goto LAB_0063122a;
    *puVar5 = 0;
LAB_00630fd4:
    pBVar7 = (Type_conflict)&this->upwardExposedMarkTempObjectLiveFields;
    do {
      pBVar7 = pBVar7->next;
      if (pBVar7 == (Type_conflict)0x0) goto LAB_00631040;
    } while ((pBVar7->data).word == 0);
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                       ,0x25c,"(this->upwardExposedMarkTempObjectLiveFields.IsEmpty())",
                       "this->upwardExposedMarkTempObjectLiveFields.IsEmpty()");
    if (!bVar3) goto LAB_0063122a;
    *puVar5 = 0;
  }
LAB_00631040:
  bVar3 = BackwardPass::DoMarkTempNumbersOnTempObjects(backwardPass);
  if ((((bVar3) && ((this->nonTempElemLoad & 1U) == 0)) &&
      (this_00 = instr->m_dst, this_00 != (Opnd *)0x0)) &&
     (OVar4 = IR::Opnd::GetKind(this_00), OVar4 == OpndKindReg)) {
    OVar4 = IR::Opnd::GetKind(this_00);
    if (OVar4 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar3) {
LAB_0063122a:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    pSVar8 = (StackSym *)this_00[1]._vptr_Opnd;
    if (((pSVar8->m_type == TyVar) ||
        (pSVar8 = StackSym::GetVarEquivSym(pSVar8,(Func *)0x0), pSVar8 != (StackSym *)0x0)) &&
       ((this->upwardExposedMarkTempObjectSymsProperties !=
         (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *)0x0 &&
        (bv2 = HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator>::GetAndClear
                         (this->upwardExposedMarkTempObjectSymsProperties,(pSVar8->super_Sym).m_id),
        bv2 != (BVSparse<Memory::JitArenaAllocator> *)0x0)))) {
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
                (&this->upwardExposedMarkTempObjectLiveFields,bv2);
      bVar3 = OpCodeAttr::TempObjectTransfer(instr->m_opcode);
      if ((bVar3) && (OVar4 = IR::Opnd::GetKind(instr->m_src1), OVar4 == OpndKindReg)) {
        pRVar9 = IR::Opnd::AsRegOpnd(instr->m_src1);
        pSVar8 = Sym::AsStackSym(&pRVar9->m_sym->super_Sym);
        stackSymID = (pSVar8->super_Sym).m_id;
        pBVar7 = bv2->head;
        if (pBVar7 != (Type_conflict)0x0) {
          this_01 = backwardPass->func->m_symTable;
          do {
            uVar13 = (pBVar7->data).word;
            if (uVar13 != 0) {
              TVar1 = pBVar7->startIndex;
              uVar12 = 0;
              if (uVar13 != 0) {
                for (; (uVar13 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                }
              }
              do {
                BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar12);
                pPVar10 = SymTable::FindPropertySym(this_01,stackSymID,TVar1 + (BVIndex)uVar12);
                if (pPVar10 != (PropertySym *)0x0) {
                  BVSparse<Memory::JitArenaAllocator>::Set
                            (&this->upwardExposedMarkTempObjectLiveFields,(pPVar10->super_Sym).m_id)
                  ;
                }
                uVar13 = uVar13 & ~(1L << (uVar12 & 0x3f));
                uVar12 = 0;
                if (uVar13 != 0) {
                  for (; (uVar13 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                  }
                }
              } while (uVar13 != 0);
            }
            pBVar7 = pBVar7->next;
          } while (pBVar7 != (Type)0x0);
        }
        ppBVar11 = HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator>::
                   FindOrInsert(this->upwardExposedMarkTempObjectSymsProperties,bv2,stackSymID);
        if (ppBVar11 == (BVSparse<Memory::JitArenaAllocator> **)0x0) {
          return;
        }
        BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>(*ppBVar11,bv2);
      }
      Memory::
      DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                ((this->super_TempTrackerBase).nonTempSyms.alloc,bv2);
      return;
    }
  }
  return;
}

Assistant:

void
NumberTemp::ProcessInstr(IR::Instr * instr, BackwardPass * backwardPass)
{
#if DBG
    if (instr->m_opcode == Js::OpCode::BailOnNoProfile)
    {
        // If we see BailOnNoProfile, we shouldn't have any successor to have any non temp syms
        Assert(!this->nonTempElemLoad);
        Assert(this->nonTempSyms.IsEmpty());
        Assert(this->tempTransferredSyms.IsEmpty());
        Assert(this->elemLoadDependencies.IsEmpty());
        Assert(this->upwardExposedMarkTempObjectLiveFields.IsEmpty());
    }
#endif

    // We don't get to process all dst in MarkTemp. Do it here for the upwardExposedMarkTempObjectLiveFields
    if (!this->DoMarkTempNumbersOnTempObjects(backwardPass))
    {
        return;
    }

    IR::Opnd * dst = instr->GetDst();
    if (dst == nullptr || !dst->IsRegOpnd())
    {
        return;
    }
    StackSym * dstSym = dst->AsRegOpnd()->m_sym;
    if (!dstSym->IsVar())
    {
        dstSym = dstSym->GetVarEquivSym(nullptr);
        if (dstSym == nullptr)
        {
            return;
        }
    }

    SymID dstSymId = dstSym->m_id;
    if (this->upwardExposedMarkTempObjectSymsProperties)
    {
        // We are assigning to dstSym, it no longer has upward exposed use, get the information and clear it from the hash table
        BVSparse<JitArenaAllocator> * dstBv = this->upwardExposedMarkTempObjectSymsProperties->GetAndClear(dstSymId);
        if (dstBv)
        {
            // Clear the upward exposed live fields of all the property sym id associated to dstSym
            this->upwardExposedMarkTempObjectLiveFields.Minus(dstBv);
            if (ObjectTemp::IsTempTransfer(instr) && instr->GetSrc1()->IsRegOpnd())
            {
                // If it is transfer, copy the dst info to the src
                SymID srcStackSymId = instr->GetSrc1()->AsRegOpnd()->m_sym->AsStackSym()->m_id;

                SymTable * symTable = backwardPass->func->m_symTable;
                FOREACH_BITSET_IN_SPARSEBV(index, dstBv)
                {
                    PropertySym * propertySym = symTable->FindPropertySym(srcStackSymId, index);
                    if (propertySym)
                    {
                        this->upwardExposedMarkTempObjectLiveFields.Set(propertySym->m_id);
                    }
                }
                NEXT_BITSET_IN_SPARSEBV;

                BVSparse<JitArenaAllocator> ** srcBv = this->upwardExposedMarkTempObjectSymsProperties->FindOrInsert(dstBv, srcStackSymId);
                if (srcBv)
                {
                    (*srcBv)->Or(dstBv);
                    JitAdelete(this->GetAllocator(), dstBv);
                }
            }
            else
            {
                JitAdelete(this->GetAllocator(), dstBv);
            }
        }
    }
}